

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

Attribute __thiscall LLVMBC::Function::getFnAttribute(Function *this,char *attribute)

{
  pointer ppVar1;
  bool bVar2;
  pointer __lhs;
  
  __lhs = (this->attributes).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->attributes).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (__lhs == ppVar1) {
      return (Attribute)(String *)0x0;
    }
    bVar2 = std::operator==(&__lhs->first,attribute);
    if (bVar2) break;
    __lhs = __lhs + 1;
  }
  return (Attribute)&__lhs->second;
}

Assistant:

Attribute Function::getFnAttribute(const char *attribute) const
{
	for (auto &attr : attributes)
		if (attr.first == attribute)
			return Attribute(&attr.second);
	return Attribute(nullptr);
}